

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockArrayStrideContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  NodeType NVar1;
  Node *pNVar2;
  TestNode *pTVar3;
  TestContext *pTVar4;
  LayoutQualifier *this;
  bool bVar5;
  bool bVar6;
  Layout local_74;
  undefined1 local_60 [8];
  SharedPtr layout;
  TestCaseGroup *blockGroup_1;
  TestCaseGroup *blockGroup;
  ProgramInterface local_28;
  bool namedNonArrayBlock;
  bool isInterfaceBlock;
  ProgramResourceQueryTestTarget queryTarget;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  queryTarget = (ProgramResourceQueryTestTarget)targetGroup;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,PROGRAMINTERFACE_UNIFORM,4);
  pNVar2 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::operator->(parentStructure);
  NVar1 = ResourceDefinition::Node::getType(pNVar2);
  bVar5 = NVar1 == TYPE_INTERFACE_BLOCK;
  bVar6 = false;
  if (bVar5) {
    pNVar2 = de::
             SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             ::get(parentStructure);
    bVar6 = false;
    if (((ulong)pNVar2[1]._vptr_Node & 1) != 0) {
      pNVar2 = de::
               SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               ::operator->(parentStructure);
      pNVar2 = ResourceDefinition::Node::getEnclosingNode(pNVar2);
      NVar1 = ResourceDefinition::Node::getType(pNVar2);
      bVar6 = NVar1 != TYPE_ARRAY_ELEMENT;
    }
  }
  if ((!bVar5) || (bVar6)) {
    pTVar3 = (TestNode *)operator_new(0x70);
    pTVar4 = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar4,"types","Types");
    tcu::TestNode::addChild((TestNode *)queryTarget,pTVar3);
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,2,false);
    generateOpaqueTypeCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,2,false);
    pTVar3 = (TestNode *)operator_new(0x70);
    pTVar4 = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar4,"aggregates","Aggregate types")
    ;
    layout.m_state = (SharedPtrStateBase *)pTVar3;
    tcu::TestNode::addChild((TestNode *)queryTarget,pTVar3);
    if (!bVar5) {
      generateBufferBackedArrayStrideTypeAggregateCases
                (context,parentStructure,(TestCaseGroup *)layout.m_state,local_28,TYPE_SAMPLER_2D,1,
                 false);
      this = (LayoutQualifier *)operator_new(0x38);
      glu::Layout::Layout(&local_74,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      ResourceDefinition::LayoutQualifier::LayoutQualifier(this,parentStructure,&local_74);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)local_60,(Node *)this);
      generateBufferBackedArrayStrideTypeAggregateCases
                (context,(SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                          *)local_60,(TestCaseGroup *)layout.m_state,local_28,
                 TYPE_UINT_ATOMIC_COUNTER,1,false);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)local_60);
    }
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)layout.m_state,local_28,TYPE_FLOAT,2,false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)layout.m_state,local_28,TYPE_BOOL,1,false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)layout.m_state,local_28,TYPE_BOOL_VEC3,2,
               false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)layout.m_state,local_28,TYPE_FLOAT_VEC3,2,
               false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)layout.m_state,local_28,TYPE_INT_VEC3,2,
               false);
  }
  else {
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)queryTarget,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,1,true);
    generateVariableArrayCases
              (context,parentStructure,(TestCaseGroup *)queryTarget,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,1);
    generateCompoundVariableCases
              (context,parentStructure,(TestCaseGroup *)queryTarget,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,1);
  }
  return;
}

Assistant:

static void generateUniformBlockArrayStrideContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ARRAY_STRIDE);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 2, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 2, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .sampler_2d_*
			if (!isInterfaceBlock)
				generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_SAMPLER_2D, 1, false);

			// .atomic_counter_*
			if (!isInterfaceBlock)
			{
				const ResourceDefinition::Node::SharedPtr layout(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
				generateBufferBackedArrayStrideTypeAggregateCases(context, layout, blockGroup, queryTarget.interface, glu::TYPE_UINT_ATOMIC_COUNTER, 1, false);
			}

			// .float_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_FLOAT, 2, false);

			// .bool_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_BOOL, 1, false);

			// .bvec3_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_BOOL_VEC3, 2, false);

			// .vec3_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_FLOAT_VEC3, 2, false);

			// .ivec2_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_INT_VEC3, 2, false);
		}
	}
	else
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateVariableArrayCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateCompoundVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
	}
}